

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_caseJump
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t value,sysbvm_tuple_t caseKeys,sysbvm_tuple_t caseDestinations,
          sysbvm_tuple_t defaultDestination)

{
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar1;
  uint uVar2;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instructionObject;
  sysbvm_tuple_t sVar3;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar4;
  long lVar5;
  ulong uVar6;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar7;
  undefined8 uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  bVar10 = (caseKeys & 0xf) != 0;
  if (bVar10 || caseKeys == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = (ulong)(*(uint *)(caseKeys + 0xc) >> 3);
  }
  bVar11 = (caseDestinations & 0xf) != 0;
  if (bVar11 || caseDestinations == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(uint *)(caseDestinations + 0xc) >> 3;
  }
  if ((uint)uVar9 != uVar2) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:576: assertion failure: caseCount == sysbvm_array_getSize(caseDestinations)"
              );
  }
  sysbvm_functionBytecodeAssembler_countExtension(context,assembler,uVar9 >> 4);
  sVar3 = sysbvm_array_create(context,uVar9 * 2 + 2);
  bVar12 = sVar3 != 0;
  bVar13 = (sVar3 & 0xf) == 0;
  if (bVar13 && bVar12) {
    *(sysbvm_tuple_t *)(sVar3 + 0x10) = value;
  }
  if (uVar9 == 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = 1;
    do {
      if (bVar10 || caseKeys == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(undefined8 *)(caseKeys + 8 + lVar5 * 8);
      }
      if (bVar13 && bVar12) {
        *(undefined8 *)(sVar3 + 0x10 + lVar5 * 8) = uVar8;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 - uVar9 != 1);
  }
  if (uVar9 != 0) {
    uVar6 = 0;
    do {
      if (bVar11 || caseDestinations == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(undefined8 *)(caseDestinations + 0x10 + uVar6 * 8);
      }
      if (bVar13 && bVar12) {
        *(undefined8 *)(lVar5 * 8 + 0x10 + sVar3 + uVar6 * 8) = uVar8;
      }
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
    lVar5 = lVar5 + uVar6;
  }
  if (bVar13 && bVar12) {
    *(sysbvm_tuple_t *)(sVar3 + 0x10 + lVar5 * 8) = defaultDestination;
  }
  psVar4 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)
           sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionBytecodeAssemblerInstruction,9);
  psVar4[1].super.header.field_0.typePointer = 0xe03;
  psVar4[1].super.header.identityHashAndFlags = (int)sVar3;
  psVar4[1].super.header.objectSize = (int)(sVar3 >> 0x20);
  psVar1 = assembler->lastInstruction;
  psVar4->previous = psVar1;
  ppsVar7 = &psVar1->next;
  if (psVar1 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    ppsVar7 = &assembler->firstInstruction;
  }
  *ppsVar7 = psVar4;
  assembler->lastInstruction = psVar4;
  psVar4->sourceASTNode = assembler->sourceASTNode;
  psVar4->sourceEnvironment = assembler->sourceEnvironment;
  psVar4->sourcePosition = assembler->sourcePosition;
  return (sysbvm_tuple_t)psVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_caseJump(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t value, sysbvm_tuple_t caseKeys, sysbvm_tuple_t caseDestinations, sysbvm_tuple_t defaultDestination)
{
    size_t caseCount = sysbvm_array_getSize(caseKeys);
    SYSBVM_ASSERT(caseCount == sysbvm_array_getSize(caseDestinations));

    sysbvm_functionBytecodeAssembler_countExtension(context, assembler, caseCount>>4);

    sysbvm_tuple_t operands = sysbvm_array_create(context, 1 + caseCount + caseCount + 1);
    size_t operandIndex = 0;
    sysbvm_array_atPut(operands, operandIndex++, value);
    for(size_t i = 0; i < caseCount; ++i)
        sysbvm_array_atPut(operands, operandIndex++, sysbvm_array_at(caseKeys, i));
    for(size_t i = 0; i < caseCount; ++i)
        sysbvm_array_atPut(operands, operandIndex++, sysbvm_array_at(caseDestinations, i));
    sysbvm_array_atPut(operands, operandIndex++, defaultDestination);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_CASE_JUMP, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}